

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s98player.cpp
# Opt level: O1

UINT8 __thiscall S98Player::SetDeviceMuting(S98Player *this,UINT32 id,PLR_MUTE_OPTS *muteOpts)

{
  void *pvVar1;
  DEVFUNC_OPTMASK p_Var2;
  PLR_DEV_OPTS *pPVar3;
  undefined3 uVar4;
  UINT32 UVar5;
  UINT8 UVar6;
  size_t sVar7;
  VGM_BASEDEV *clDev;
  pointer pSVar8;
  long lVar9;
  bool bVar10;
  
  sVar7 = DeviceID2OptionID(this,id);
  if (sVar7 == 0xffffffffffffffff) {
    UVar6 = 0x80;
  }
  else {
    this->_devOpts[sVar7].muteOpts.chnMute[1] = muteOpts->chnMute[1];
    uVar4 = *(undefined3 *)&muteOpts->field_0x1;
    UVar5 = muteOpts->chnMute[0];
    pPVar3 = this->_devOpts + sVar7;
    (pPVar3->muteOpts).disable = muteOpts->disable;
    *(undefined3 *)&(pPVar3->muteOpts).field_0x1 = uVar4;
    (pPVar3->muteOpts).chnMute[0] = UVar5;
    pSVar8 = (this->_devices).
             super__Vector_base<S98Player::S98_CHIPDEV,_std::allocator<S98Player::S98_CHIPDEV>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if (this->_optDevMap[sVar7] <
        (ulong)(((long)(this->_devices).
                       super__Vector_base<S98Player::S98_CHIPDEV,_std::allocator<S98Player::S98_CHIPDEV>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar8 >> 6) *
               -0x5555555555555555)) {
      pSVar8 = pSVar8 + this->_optDevMap[sVar7];
      lVar9 = 0;
      do {
        pvVar1 = (pSVar8->base).defInf.dataPtr;
        if ((pvVar1 != (void *)0x0) &&
           (p_Var2 = ((pSVar8->base).defInf.devDef)->SetMuteMask, p_Var2 != (DEVFUNC_OPTMASK)0x0)) {
          (*p_Var2)(pvVar1,*(UINT32 *)((long)this->_devOpts[sVar7].muteOpts.chnMute + lVar9));
        }
        pSVar8 = (pointer)(pSVar8->base).linkDev;
        UVar6 = '\0';
      } while ((pSVar8 != (pointer)0x0) && (bVar10 = lVar9 == 0, lVar9 = lVar9 + 4, bVar10));
    }
    else {
      UVar6 = '\0';
    }
  }
  return UVar6;
}

Assistant:

UINT8 S98Player::SetDeviceMuting(UINT32 id, const PLR_MUTE_OPTS& muteOpts)
{
	size_t optID = DeviceID2OptionID(id);
	if (optID == (size_t)-1)
		return 0x80;	// bad device ID
	
	_devOpts[optID].muteOpts = muteOpts;
	
	size_t devID = _optDevMap[optID];
	if (devID < _devices.size())
		RefreshMuting(_devices[devID], _devOpts[optID].muteOpts);
	return 0x00;
}